

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::AllocateLoopHeaders(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  LoopHeader *pLVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  uint local_5c;
  uint i;
  LoopHeader *loopHeaderArray;
  TrackAllocData local_40;
  uint local_14;
  FunctionBody *pFStack_10;
  uint loopCount;
  FunctionBody *this_local;
  
  pFStack_10 = this;
  pLVar3 = GetLoopHeaderArray(this);
  if (pLVar3 != (LoopHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ac2,"(this->GetLoopHeaderArray() == nullptr)",
                                "this->GetLoopHeaderArray() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_14 = GetLoopCount(this);
  if (local_14 != 0) {
    pRVar5 = ScriptContext::GetRecycler
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&LoopHeader::typeinfo,0,(ulong)local_14,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1ac7);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
    pLVar3 = Memory::AllocateArray<Memory::Recycler,Js::LoopHeader,false>
                       ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)local_14);
    SetLoopHeaderArray(this,pLVar3);
    pLVar3 = GetLoopHeaderArray(this);
    for (local_5c = 0; local_5c < local_14; local_5c = local_5c + 1) {
      LoopHeader::Init(pLVar3 + local_5c,this);
    }
  }
  return;
}

Assistant:

void FunctionBody::AllocateLoopHeaders()
    {
        Assert(this->GetLoopHeaderArray() == nullptr);

        uint loopCount = GetLoopCount();
        if (loopCount != 0)
        {
            this->SetLoopHeaderArray(RecyclerNewArrayZ(this->m_scriptContext->GetRecycler(), LoopHeader, loopCount));
            auto loopHeaderArray = this->GetLoopHeaderArray();
            for (uint i = 0; i < loopCount; i++)
            {
                loopHeaderArray[i].Init(this);
            }
        }
    }